

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O1

wchar_t attr_counter_inc(attr_counter **top,attr_counter *ac,attr_counter *last,
                        mtree_entry_conflict *me)

{
  wchar_t wVar1;
  wchar_t wVar2;
  attr_counter *paVar3;
  attr_counter *paVar4;
  wchar_t wVar5;
  bool bVar6;
  
  if (ac == (attr_counter *)0x0) {
    wVar5 = L'\0';
    if (last != (attr_counter *)0x0) {
      paVar3 = (attr_counter *)malloc(0x20);
      if (paVar3 == (attr_counter *)0x0) {
        wVar5 = L'\xffffffff';
      }
      else {
        paVar3->prev = last;
        paVar3->next = (attr_counter *)0x0;
        paVar3->count = L'\x01';
        paVar3->m_entry = me;
        last->next = paVar3;
      }
    }
  }
  else {
    wVar1 = ac->count;
    ac->count = wVar1 + L'\x01';
    wVar5 = L'\0';
    if ((*top != ac) && (paVar3 = ac->prev, wVar5 = L'\0', paVar3->count <= wVar1)) {
      bVar6 = paVar3 == (attr_counter *)0x0;
      paVar4 = paVar3;
      if (!bVar6) {
        wVar2 = paVar3->count;
        while (wVar2 <= wVar1) {
          paVar4 = paVar4->prev;
          bVar6 = paVar4 == (attr_counter *)0x0;
          if (bVar6) break;
          wVar2 = paVar4->count;
        }
      }
      paVar3->next = ac->next;
      if (ac->next != (attr_counter *)0x0) {
        ac->next->prev = paVar3;
      }
      if (bVar6) {
        ac->prev = (attr_counter *)0x0;
        ac->next = *top;
        *top = ac;
        paVar3 = ac->next;
      }
      else {
        ac->prev = paVar4;
        ac->next = paVar4->next;
        paVar4->next = ac;
        paVar3 = ac->next;
        if (paVar3 == (attr_counter *)0x0) {
          return L'\0';
        }
      }
      paVar3->prev = ac;
    }
  }
  return wVar5;
}

Assistant:

static int
attr_counter_inc(struct attr_counter **top, struct attr_counter *ac,
    struct attr_counter *last, struct mtree_entry *me)
{
	struct attr_counter *pac;

	if (ac != NULL) {
		ac->count++;
		if (*top == ac || ac->prev->count >= ac->count)
			return (0);
		for (pac = ac->prev; pac; pac = pac->prev) {
			if (pac->count >= ac->count)
				break;
		}
		ac->prev->next = ac->next;
		if (ac->next != NULL)
			ac->next->prev = ac->prev;
		if (pac != NULL) {
			ac->prev = pac;
			ac->next = pac->next;
			pac->next = ac;
			if (ac->next != NULL)
				ac->next->prev = ac;
		} else {
			ac->prev = NULL;
			ac->next = *top;
			*top = ac;
			ac->next->prev = ac;
		}
	} else if (last != NULL) {
		ac = attr_counter_new(me, last);
		if (ac == NULL)
			return (-1);
		last->next = ac;
	}
	return (0);
}